

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

void btvv(void)

{
  bool bVar1;
  int local_14;
  frameex1 *pfStack_10;
  LispPTR atomindex;
  frameex1 *fx_addr68k;
  
  pfStack_10 = (frameex1 *)(MachineState.pvar + -10);
  local_14 = get_framename(pfStack_10);
  while( true ) {
    bVar1 = false;
    if (local_14 != 0x4c) {
      bVar1 = pfStack_10->alink != 0xb;
    }
    if (!bVar1) break;
    sf(pfStack_10);
    pfStack_10 = get_nextFX(pfStack_10);
    local_14 = get_framename(pfStack_10);
  }
  sf(pfStack_10);
  printf("\n BTV! end ********\n");
  return;
}

Assistant:

void btvv(void) {
  struct frameex1 *fx_addr68k;
  LispPTR atomindex;
  FX *get_nextFX(FX * fx);

  fx_addr68k = CURRENTFX;

  atomindex = get_framename(fx_addr68k);

  while ((atomindex != ATOM_T) && (fx_addr68k->alink != 11)) {
    sf(fx_addr68k);
    fx_addr68k = get_nextFX(fx_addr68k);
    atomindex = get_framename(fx_addr68k);
  }

  sf(fx_addr68k);

  printf("\n BTV! end ********\n");

}